

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O3

void __thiscall RunContext::Run(RunContext *this)

{
  BaseNode *pBVar1;
  pointer pCVar2;
  pointer ppBVar3;
  pointer ppBVar4;
  pointer ppBVar5;
  bool bVar6;
  int iVar7;
  Connection *c;
  pointer this_00;
  pointer ppBVar8;
  pointer ppBVar9;
  pointer ppBVar10;
  
  ppBVar9 = (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar9) {
    (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar9;
  }
  ppBVar4 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppBVar10 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pBVar1 = *ppBVar10;
      pCVar2 = (pBVar1->connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (pBVar1->connections).
                     super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppBVar5 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish, this_00 != pCVar2; this_00 = this_00 + 1) {
        if (((BaseNode *)this_00->output_node == pBVar1) &&
           (bVar6 = Connection::Prepare(this_00,this), !bVar6)) {
          return;
        }
      }
      ppBVar10 = ppBVar10 + 1;
      ppBVar8 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (ppBVar10 != ppBVar4);
    for (; ppBVar8 != ppBVar5; ppBVar8 = ppBVar8 + 1) {
      iVar7 = (*(*ppBVar8)->_vptr_BaseNode[4])(*ppBVar8,this);
      if ((char)iVar7 == '\0') {
        return;
      }
    }
  }
  ppBVar3 = (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar9 = (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar9 != ppBVar3; ppBVar9 = ppBVar9 + 1
      ) {
    (*(*ppBVar9)->_vptr_Block[2])();
  }
  return;
}

Assistant:

void RunContext::Run()
{
    pipeline.Clear();

    for (auto node : nodes)
    {
        for (auto& c : node->connections)
        {
            if (c.output_node != node)
                continue;
            if (!c.Prepare(*this))
            {
                return;
            }
        }
    }

    for (auto node : nodes)
    {
        if (!node->Prepare(*this))
        {
            return;
        }
    }

    pipeline.Launch();
}